

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
CompilerContext::compile_conditions
          (CompilerContext *this,SyntaxTree *conds_node,shared_ptr<Label> *else_ptr)

{
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_00;
  NodeType NVar1;
  Command *pCVar2;
  unreachable_exception *this_00;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_188;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_128;
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  local_101;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  local_100;
  undefined1 local_c8 [43];
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  local_9d [13];
  ArgVariant *local_90;
  ArgVariant local_88;
  undefined1 local_50 [40];
  undefined8 local_28;
  anon_class_8_1_8991fb9c compile_multi_andor;
  shared_ptr<Label> *else_ptr_local;
  SyntaxTree *conds_node_local;
  CompilerContext *this_local;
  
  local_28 = this;
  compile_multi_andor.this = (CompilerContext *)else_ptr;
  NVar1 = SyntaxTree::type(conds_node);
  if ((NVar1 != Command) && (NVar1 != NOT)) {
    if (NVar1 == AND) {
      compile_conditions(SyntaxTree_const&,std::shared_ptr<Label>const&)::$_0::operator()
                (&local_28,conds_node,1);
      goto LAB_002c8455;
    }
    if (NVar1 == OR) {
      compile_conditions(SyntaxTree_const&,std::shared_ptr<Label>const&)::$_0::operator()
                (&local_28,conds_node,0x15);
      goto LAB_002c8455;
    }
    if (4 < NVar1 - Equal) {
      this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this_00,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(631)."
                );
      __cxa_throw(this_00,&unreachable_exception::typeinfo,
                  unreachable_exception::~unreachable_exception);
    }
  }
  if (((this->program->opt).optimize_andor & 1U) == 0) {
    pCVar2 = std::experimental::optional<const_Command_&>::operator*(&this->commands->andor);
    local_90 = &local_88;
    conv_int<int,void>(local_90,0);
    local_50._0_8_ = &local_88;
    local_50._8_8_ = 1;
    std::
    allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
    ::allocator(local_9d);
    __l_00._M_len = local_50._8_8_;
    __l_00._M_array = (iterator)local_50._0_8_;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
              *)(local_50 + 0x10),__l_00,local_9d);
    compile_command(this,pCVar2,(ArgList *)(local_50 + 0x10),false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
               *)(local_50 + 0x10));
    std::
    allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
    ::~allocator(local_9d);
    local_128 = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                 *)local_50;
    do {
      local_128 = local_128 + -1;
      eggs::variants::
      variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
      ::~variant(local_128);
    } while (local_128 != &local_88);
  }
  compile_condition(this,conds_node,false);
LAB_002c8455:
  pCVar2 = std::experimental::optional<const_Command_&>::operator*(&this->commands->goto_if_false);
  eggs::variants::
  variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
  variant<std::shared_ptr<Label>const&,5ul,std::shared_ptr<Label>>
            ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
              *)&local_100,(shared_ptr<Label> *)compile_multi_andor.this);
  local_c8._8_8_ = 1;
  local_c8._0_8_ =
       (variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
        *)&local_100;
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::allocator(&local_101);
  __l._M_len = local_c8._8_8_;
  __l._M_array = (iterator)local_c8._0_8_;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
            *)(local_c8 + 0x10),__l,&local_101);
  compile_command(this,pCVar2,(ArgList *)(local_c8 + 0x10),false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             *)(local_c8 + 0x10));
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::~allocator(&local_101);
  local_188 = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
               *)local_c8;
  do {
    local_188 = local_188 + -1;
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(local_188);
  } while (local_188 != &local_100);
  return;
}

Assistant:

void CompilerContext::compile_conditions(const SyntaxTree& conds_node, const shared_ptr<Label>& else_ptr)
{
    auto compile_multi_andor = [this](const auto& conds_node, size_t op)
    {
        assert(conds_node.child_count() <= 8);
        compile_command(*this->commands.andor, { conv_int(op + conds_node.child_count() - 2) });
        for(auto& cond : conds_node) compile_condition(*cond);
    };

    switch(conds_node.type())
    {
        // single condition (also see compile_condition)
        case NodeType::NOT:
        case NodeType::Command:
        case NodeType::Equal:
        case NodeType::Greater:
        case NodeType::GreaterEqual:
        case NodeType::Lesser:
        case NodeType::LesserEqual:
            if (!this->program.opt.optimize_andor)
                compile_command(*this->commands.andor, { conv_int(0) });
            compile_condition(conds_node);
            break;
        case NodeType::AND: // 1-8
            compile_multi_andor(conds_node, 1);
            break;
        case NodeType::OR: // 21-28
            compile_multi_andor(conds_node, 21);
            break;
        default:
            Unreachable();
    }

    compile_command(*this->commands.goto_if_false, { else_ptr });
}